

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer_linux.hpp
# Opt level: O2

bool __thiscall
Fossilize::ExternalReplayer::Impl::get_failed
          (Impl *this,
          vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
          *failed,size_t *count,uint *indices,Hash *hashes)

{
  pointer ppVar1;
  const_iterator __begin2;
  pointer ppVar2;
  long lVar3;
  
  if (hashes == (Hash *)0x0) {
    *count = (long)(failed->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(failed->
                   super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  else {
    ppVar2 = (failed->
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (failed->
             super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (*count != (long)ppVar1 - (long)ppVar2 >> 4) {
      return false;
    }
    lVar3 = 0;
    for (; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
      *(uint *)((long)indices + lVar3 * 2) = ppVar2->first;
      *(unsigned_long *)((long)hashes + lVar3 * 4) = ppVar2->second;
      lVar3 = lVar3 + 2;
    }
  }
  return true;
}

Assistant:

bool ExternalReplayer::Impl::get_failed(const std::vector<std::pair<unsigned, Hash>> &failed,
                                        size_t *count, unsigned *indices, Hash *hashes) const
{
	if (hashes)
	{
		if (*count != failed.size())
			return false;

		for (auto &mod : failed)
		{
			*indices++ = mod.first;
			*hashes++ = mod.second;
		}
		return true;
	}
	else
	{
		*count = failed.size();
		return true;
	}
}